

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::ConfigDeclarationSyntax::ConfigDeclarationSyntax
          (ConfigDeclarationSyntax *this,ConfigDeclarationSyntax *param_2)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  
  (this->super_MemberSyntax).super_SyntaxNode.previewNode =
       (param_2->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(param_2->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (param_2->super_MemberSyntax).super_SyntaxNode.parent;
  (this->super_MemberSyntax).super_SyntaxNode.kind =
       (param_2->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(this->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (this->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar6 = *(undefined4 *)
           &(param_2->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (param_2->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (param_2->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (param_2->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (param_2->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (param_2->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (param_2->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b0da0;
  uVar7 = (param_2->config).field_0x2;
  NVar8.raw = (param_2->config).numFlags.raw;
  uVar9 = (param_2->config).rawLen;
  pIVar3 = (param_2->config).info;
  TVar10 = (param_2->name).kind;
  uVar11 = (param_2->name).field_0x2;
  NVar12.raw = (param_2->name).numFlags.raw;
  uVar13 = (param_2->name).rawLen;
  pIVar4 = (param_2->name).info;
  TVar14 = (param_2->semi1).kind;
  uVar15 = (param_2->semi1).field_0x2;
  NVar16.raw = (param_2->semi1).numFlags.raw;
  uVar17 = (param_2->semi1).rawLen;
  pIVar5 = (param_2->semi1).info;
  (this->config).kind = (param_2->config).kind;
  (this->config).field_0x2 = uVar7;
  (this->config).numFlags = (NumericTokenFlags)NVar8.raw;
  (this->config).rawLen = uVar9;
  (this->config).info = pIVar3;
  (this->name).kind = TVar10;
  (this->name).field_0x2 = uVar11;
  (this->name).numFlags = (NumericTokenFlags)NVar12.raw;
  (this->name).rawLen = uVar13;
  (this->name).info = pIVar4;
  (this->semi1).kind = TVar14;
  (this->semi1).field_0x2 = uVar15;
  (this->semi1).numFlags = (NumericTokenFlags)NVar16.raw;
  (this->semi1).rawLen = uVar17;
  (this->semi1).info = pIVar5;
  uVar6 = *(undefined4 *)&(param_2->localparams).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (param_2->localparams).super_SyntaxListBase.super_SyntaxNode.parent;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.kind =
       (param_2->localparams).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(this->localparams).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->localparams).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (param_2->localparams).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (this->localparams).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (this->localparams).super_SyntaxListBase.childCount =
       (param_2->localparams).super_SyntaxListBase.childCount;
  sVar2 = (param_2->localparams).
          super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (this->localparams).
  super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>._M_ptr =
       (param_2->localparams).
       super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>.
       _M_ptr;
  (this->localparams).
  super_span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>._M_extent
  ._M_extent_value = sVar2;
  (this->localparams).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b1360;
  uVar7 = (param_2->design).field_0x2;
  NVar8.raw = (param_2->design).numFlags.raw;
  uVar9 = (param_2->design).rawLen;
  pIVar3 = (param_2->design).info;
  (this->design).kind = (param_2->design).kind;
  (this->design).field_0x2 = uVar7;
  (this->design).numFlags = (NumericTokenFlags)NVar8.raw;
  (this->design).rawLen = uVar9;
  (this->design).info = pIVar3;
  uVar6 = *(undefined4 *)&(param_2->topCells).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (param_2->topCells).super_SyntaxListBase.super_SyntaxNode.parent;
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.kind =
       (param_2->topCells).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(this->topCells).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->topCells).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (param_2->topCells).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (this->topCells).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (this->topCells).super_SyntaxListBase.childCount =
       (param_2->topCells).super_SyntaxListBase.childCount;
  sVar2 = (param_2->topCells).
          super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (this->topCells).super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>.
  _M_ptr = (param_2->topCells).
           super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>._M_ptr;
  (this->topCells).super_span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (this->topCells).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005b13e8;
  uVar7 = (param_2->semi2).field_0x2;
  NVar8.raw = (param_2->semi2).numFlags.raw;
  uVar9 = (param_2->semi2).rawLen;
  pIVar3 = (param_2->semi2).info;
  (this->semi2).kind = (param_2->semi2).kind;
  (this->semi2).field_0x2 = uVar7;
  (this->semi2).numFlags = (NumericTokenFlags)NVar8.raw;
  (this->semi2).rawLen = uVar9;
  (this->semi2).info = pIVar3;
  uVar6 = *(undefined4 *)&(param_2->rules).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (param_2->rules).super_SyntaxListBase.super_SyntaxNode.parent;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.kind =
       (param_2->rules).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(this->rules).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (param_2->rules).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (this->rules).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (this->rules).super_SyntaxListBase.childCount = (param_2->rules).super_SyntaxListBase.childCount;
  sVar2 = (param_2->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>._M_ptr =
       (param_2->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>._M_ptr
  ;
  (this->rules).super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->rules).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005b1470;
  uVar7 = (param_2->endconfig).field_0x2;
  NVar8.raw = (param_2->endconfig).numFlags.raw;
  uVar9 = (param_2->endconfig).rawLen;
  pIVar3 = (param_2->endconfig).info;
  (this->endconfig).kind = (param_2->endconfig).kind;
  (this->endconfig).field_0x2 = uVar7;
  (this->endconfig).numFlags = (NumericTokenFlags)NVar8.raw;
  (this->endconfig).rawLen = uVar9;
  (this->endconfig).info = pIVar3;
  this->blockName = param_2->blockName;
  return;
}

Assistant:

explicit MemberSyntax(const MemberSyntax&) = default;